

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Abc_TtIsSubsetWithMask(word *pSmall,word *pLarge,word *pMask,int nWords)

{
  int local_30;
  int w;
  int nWords_local;
  word *pMask_local;
  word *pLarge_local;
  word *pSmall_local;
  
  local_30 = 0;
  while( true ) {
    if (nWords <= local_30) {
      return 1;
    }
    if ((pSmall[local_30] & pLarge[local_30] & pMask[local_30]) !=
        (pSmall[local_30] & pMask[local_30])) break;
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

static int Abc_TtIsSubsetWithMask( word * pSmall, word * pLarge, word * pMask, int nWords )
{
    int w;
    for ( w = 0; w < nWords; ++w )
        if ( ( pSmall[w] & pLarge[w] & pMask[w] ) != ( pSmall[w] & pMask[w] ) )
            return 0;
    return 1;
}